

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boyer_moore.hpp
# Opt level: O3

__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 __thiscall
boost::xpressive::detail::
boyer_moore<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
::find_(boyer_moore<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
        *this,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              begin,
       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       end,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  long lVar4;
  ulong uVar5;
  difference_type __d;
  char *pcVar6;
  ulong uVar7;
  byte *pbVar8;
  
  lVar4 = (long)end._M_current - (long)begin._M_current;
  uVar5 = (ulong)this->length_;
  if ((long)uVar5 < lVar4) {
    uVar7 = uVar5;
    do {
      pbVar3 = (byte *)(begin._M_current + uVar7);
      begin._M_current = begin._M_current + uVar7;
      pcVar6 = begin._M_current;
      pbVar8 = (byte *)this->last_;
      if (*pbVar3 == *this->last_) {
        do {
          if (pbVar8 == (byte *)this->begin_) {
            return (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )pcVar6;
          }
          pbVar1 = (byte *)(pcVar6 + -1);
          pbVar2 = pbVar8 + -1;
          pcVar6 = pcVar6 + -1;
          pbVar8 = pbVar8 + -1;
        } while (*pbVar1 == *pbVar2);
      }
      uVar7 = (ulong)this->offsets_[*pbVar3];
      uVar5 = uVar5 + uVar7;
    } while ((long)uVar5 < lVar4);
  }
  return (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )end._M_current;
}

Assistant:

BidiIter find_(BidiIter begin, BidiIter end, Traits const &tr) const
    {
        typedef typename boost::iterator_difference<BidiIter>::type diff_type;
        diff_type const endpos = std::distance(begin, end);
        diff_type offset = static_cast<diff_type>(this->length_);

        for(diff_type curpos = offset; curpos < endpos; curpos += offset)
        {
            std::advance(begin, offset);

            char_type const *pat_tmp = this->last_;
            BidiIter str_tmp = begin;

            for(; tr.translate(*str_tmp) == *pat_tmp; --pat_tmp, --str_tmp)
            {
                if(pat_tmp == this->begin_)
                {
                    return str_tmp;
                }
            }

            offset = this->offsets_[tr.hash(tr.translate(*begin))];
        }

        return end;
    }